

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void transfer_file_data(mg_connection *nc)

{
  size_t *psVar1;
  byte *pbVar2;
  int iVar3;
  undefined8 *puVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  ulong __n;
  ulong uVar8;
  char buf [4096];
  
  puVar4 = (undefined8 *)nc->proto_data;
  iVar3 = *(int *)(puVar4 + 5);
  if (iVar3 == 3) {
    if ((mg_connection *)puVar4[4] != (mg_connection *)0x0) {
      mg_forward(nc,(mg_connection *)puVar4[4]);
      return;
    }
    pbVar2 = (byte *)((long)&nc->flags + 1);
    *pbVar2 = *pbVar2 | 4;
  }
  else {
    uVar7 = puVar4[1] - puVar4[2];
    if (iVar3 == 2) {
      if ((long)uVar7 < 1) {
        sVar6 = 0;
      }
      else {
        sVar6 = (nc->recv_mbuf).len;
        if ((long)uVar7 < (long)sVar6) {
          sVar6 = uVar7;
        }
      }
      sVar6 = fwrite((nc->recv_mbuf).buf,1,sVar6,(FILE *)*puVar4);
      if (sVar6 != 0) {
        mbuf_remove(&nc->recv_mbuf,sVar6);
        lVar5 = puVar4[2];
        puVar4[2] = sVar6 + lVar5;
        if ((long)(sVar6 + lVar5) < (long)puVar4[1]) {
          return;
        }
      }
LAB_0010c5ae:
      free_http_proto_data(nc);
      return;
    }
    if (iVar3 == 1) {
      psVar1 = &(nc->send_mbuf).len;
      uVar8 = 0;
      if (*psVar1 < 0x1001) {
        uVar8 = 0x1000 - *psVar1;
      }
      __n = uVar7;
      if (uVar8 < uVar7) {
        __n = uVar8;
      }
      if ((long)uVar7 < 1) {
        __n = uVar8;
      }
      if (__n != 0) {
        if (((long)puVar4[1] <= (long)puVar4[2]) ||
           (sVar6 = fread(buf,1,__n,(FILE *)*puVar4), sVar6 == 0)) goto LAB_0010c5ae;
        mg_send(nc,buf,(int)sVar6);
        puVar4[2] = puVar4[2] + sVar6;
      }
    }
  }
  return;
}

Assistant:

static void transfer_file_data(struct mg_connection *nc) {
    struct proto_data_http *dp = (struct proto_data_http *) nc->proto_data;
    char buf[MG_MAX_HTTP_SEND_IOBUF];
    int64_t left = dp->cl - dp->sent;
    size_t n = 0, to_read = 0;

    if (dp->type == DATA_FILE) {
        struct mbuf *io = &nc->send_mbuf;
        if (io->len < sizeof(buf)) {
            to_read = sizeof(buf) - io->len;
        }

        if (left > 0 && to_read > (size_t) left) {
            to_read = left;
        }

        if (to_read == 0) {
            /* Rate limiting. send_mbuf is too full, wait until it's drained. */
        } else if (dp->sent < dp->cl && (n = fread(buf, 1, to_read, dp->fp)) > 0) {
            mg_send(nc, buf, n);
            dp->sent += n;
        } else {
            free_http_proto_data(nc);
#ifdef MG_DISABLE_HTTP_KEEP_ALIVE
            nc->flags |= MG_F_SEND_AND_CLOSE;
#endif
        }
    } else if (dp->type == DATA_PUT) {
        struct mbuf *io = &nc->recv_mbuf;
        size_t to_write =
                left <= 0 ? 0 : left < (int64_t) io->len ? (size_t) left : io->len;
        size_t n = fwrite(io->buf, 1, to_write, dp->fp);
        if (n > 0) {
            mbuf_remove(io, n);
            dp->sent += n;
        }
        if (n == 0 || dp->sent >= dp->cl) {
            free_http_proto_data(nc);
#ifdef MG_DISABLE_HTTP_KEEP_ALIVE
            nc->flags |= MG_F_SEND_AND_CLOSE;
#endif
        }
    } else if (dp->type == DATA_CGI) {
        /* This is POST data that needs to be forwarded to the CGI process */
        if (dp->cgi_nc != NULL) {
            mg_forward(nc, dp->cgi_nc);
        } else {
            nc->flags |= MG_F_SEND_AND_CLOSE;
        }
    }
}